

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

Duration * __thiscall absl::lts_20250127::Duration::operator/=(Duration *this,int64_t r)

{
  HiRep this_00;
  uint128 *__y;
  uint32_t in_EDX;
  uint128 uVar1;
  uint128 u128;
  Duration d;
  Duration d_00;
  Duration DVar2;
  divides<absl::lts_20250127::uint128> local_49;
  uint128 b;
  uint128 a;
  
  this_00 = this->rep_hi_;
  d.rep_hi_.hi_ = 0;
  d.rep_hi_.lo_ = this->rep_lo_;
  if (r == 0 || this->rep_lo_ == 0xffffffff) {
    if ((long)((ulong)this_00 ^ r) < 0) {
      d_00.rep_lo_ = in_EDX;
      d_00.rep_hi_.lo_ = 0xffffffff;
      d_00.rep_hi_.hi_ = 0xffffffff;
      DVar2 = operator-((lts_20250127 *)0x7fffffffffffffff,d_00);
    }
    else {
      DVar2.rep_lo_ = 0xffffffff;
      DVar2.rep_hi_.lo_ = 0xffffffff;
      DVar2.rep_hi_.hi_ = 0x7fffffff;
    }
  }
  else {
    d.rep_lo_ = in_EDX;
    a = anon_unknown_1::MakeU128Ticks((anon_unknown_1 *)this_00,d);
    b = anon_unknown_1::MakeU128(r);
    __y = &b;
    uVar1 = std::divides<absl::lts_20250127::uint128>::operator()(&local_49,&a,__y);
    u128.hi_ = ((ulong)this_00 ^ r) >> 0x3f;
    u128.lo_ = uVar1.hi_;
    DVar2 = anon_unknown_1::MakeDurationFromU128((anon_unknown_1 *)uVar1.lo_,u128,SUB81(__y,0));
  }
  *this = DVar2;
  return this;
}

Assistant:

Duration& Duration::operator/=(int64_t r) {
  if (time_internal::IsInfiniteDuration(*this) || r == 0) {
    const bool is_neg = (r < 0) != (rep_hi_.Get() < 0);
    return *this = is_neg ? -InfiniteDuration() : InfiniteDuration();
  }
  return *this = ScaleFixed<std::divides>(*this, r);
}